

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnIfExpr(BinaryReaderIR *this,Type sig_type)

{
  Expr *pEVar1;
  Result RVar2;
  pointer __p;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  MakeUnique<wabt::IfExpr>();
  SetBlockDeclaration(this,(BlockDeclaration *)&local_30[1].loc.filename.size_,sig_type);
  pEVar1 = local_30;
  local_30 = (Expr *)0x0;
  local_38._M_head_impl = pEVar1;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar2.enum_ != Error) {
    PushLabel(this,If,(ExprList *)&pEVar1[3].loc.filename.size_,(Expr *)0x0);
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnIfExpr(Type sig_type) {
  auto expr = MakeUnique<IfExpr>();
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::If, expr_list);
  return Result::Ok;
}